

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O3

double XmlRpc::XmlRpcUtil::log(double __x)

{
  char in_AL;
  char *in_RSI;
  int in_EDI;
  va_list va;
  char buf [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [48];
  double local_498;
  char local_418 [1023];
  undefined1 local_19;
  
  if (in_AL != '\0') {
    local_498 = __x;
  }
  if (in_EDI <= XmlRpcLogHandler::_verbosity) {
    local_4e8 = 0x3000000010;
    local_4e0 = &va[0].overflow_arg_area;
    local_4d8 = local_4c8;
    vsnprintf(local_418,0x3ff,in_RSI,&local_4e8);
    local_19 = 0;
    __x = (double)(**(code **)(*(long *)XmlRpcLogHandler::_logHandler + 0x10))
                            (XmlRpcLogHandler::_logHandler,in_EDI,local_418);
  }
  return __x;
}

Assistant:

void XmlRpcUtil::log(int level, const char* fmt, ...)
{
  if (level <= XmlRpcLogHandler::getVerbosity())
  {
    va_list va;
    char buf[1024];
    va_start( va, fmt);
    std::vsnprintf(buf,sizeof(buf)-1,fmt,va);
    va_end(va);
    buf[sizeof(buf)-1] = 0;
    XmlRpcLogHandler::getLogHandler()->log(level, buf);
  }
}